

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O3

void Gia_ManTerStatesFree(Vec_Ptr_t *vStates)

{
  int iVar1;
  long lVar2;
  
  iVar1 = vStates->nSize;
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      if (vStates->pArray[lVar2] != (void *)0x0) {
        free(vStates->pArray[lVar2]);
        iVar1 = vStates->nSize;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < iVar1);
  }
  if (vStates->pArray != (void **)0x0) {
    free(vStates->pArray);
  }
  free(vStates);
  return;
}

Assistant:

void Gia_ManTerStatesFree( Vec_Ptr_t * vStates )
{
    unsigned * pTemp;
    int i;
    Vec_PtrForEachEntry( unsigned *, vStates, pTemp, i )
        ABC_FREE( pTemp );
    Vec_PtrFree( vStates );
}